

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MultiPortSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::MultiPortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::PortSymbol_const*,18446744073709551615ul>,slang::ast::ArgumentDirection&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,
          span<const_slang::ast::PortSymbol_*,_18446744073709551615UL> *args_2,
          ArgumentDirection *args_3)

{
  span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL> ports;
  string_view name;
  MultiPortSymbol *__s;
  char *in_RCX;
  undefined8 *in_RDX;
  size_t *in_RSI;
  size_t in_R8;
  size_t in_stack_ffffffffffffffa8;
  span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL> *in_stack_ffffffffffffffb0;
  MultiPortSymbol *in_stack_ffffffffffffffb8;
  pointer ppPVar1;
  __extent_storage<18446744073709551615UL> _Var2;
  SourceLocation loc;
  
  __s = (MultiPortSymbol *)
        allocate((BumpAllocator *)in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
  _Var2._M_extent_value = *in_RSI;
  loc = *(SourceLocation *)(in_RSI + 1);
  ppPVar1 = (pointer)*in_RDX;
  std::span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::PortSymbol_*,_18446744073709551615UL>
            (in_stack_ffffffffffffffb0,
             (span<const_slang::ast::PortSymbol_*,_18446744073709551615UL> *)__s);
  name._M_str = in_RCX;
  name._M_len = in_R8;
  ports._M_extent._M_extent_value = _Var2._M_extent_value;
  ports._M_ptr = ppPVar1;
  slang::ast::MultiPortSymbol::MultiPortSymbol
            (in_stack_ffffffffffffffb8,name,loc,ports,(ArgumentDirection)in_RSI);
  return __s;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }